

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMAddressingModes.h
# Opt level: O2

float getFPImmFloat(uint Imm)

{
  return (float)(((Imm & 0x3f) << 0x13 | (Imm & 0xffffffc0) << 0x18 |
                 (int)(Imm << 0x19) >> 0x1f & 0x3e000000U) ^ 0x40000000);
}

Assistant:

static inline float getFPImmFloat(unsigned Imm)
{
	// We expect an 8-bit binary encoding of a floating-point number here.
	union {
		uint32_t I;
		float F;
	} FPUnion;

	uint8_t Sign = (Imm >> 7) & 0x1;
	uint8_t Exp = (Imm >> 4) & 0x7;
	uint8_t Mantissa = Imm & 0xf;

	//   8-bit FP    iEEEE Float Encoding
	//   abcd efgh   aBbbbbbc defgh000 00000000 00000000
	//
	// where B = NOT(b);

	FPUnion.I = 0;
	FPUnion.I |= Sign << 31;
	FPUnion.I |= ((Exp & 0x4) != 0 ? 0 : 1) << 30;
	FPUnion.I |= ((Exp & 0x4) != 0 ? 0x1f : 0) << 25;
	FPUnion.I |= (Exp & 0x3) << 23;
	FPUnion.I |= Mantissa << 19;
	return FPUnion.F;
}